

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int disarm_shooting_trap(trap *ttmp,int otyp,schar dx,schar dy)

{
  int local_2c;
  int fails;
  schar dy_local;
  schar dx_local;
  int otyp_local;
  trap *ttmp_local;
  
  ttmp_local._4_4_ = try_disarm(ttmp,'\0',dx,dy);
  if (1 < ttmp_local._4_4_) {
    pline("You disarm %s trap.",the_your[(byte)ttmp->field_0x8 >> 7]);
    if (otyp == 8) {
      local_2c = rnl(10);
      local_2c = 10 - local_2c;
    }
    else {
      local_2c = rnl(0x32);
      local_2c = 0x32 - local_2c;
    }
    cnv_trap_obj(otyp,local_2c,ttmp);
    ttmp_local._4_4_ = 1;
  }
  return ttmp_local._4_4_;
}

Assistant:

static int disarm_shooting_trap(struct trap *ttmp, int otyp, schar dx, schar dy)
{
	int fails = try_disarm(ttmp, FALSE, dx, dy);

	if (fails < 2)
	    return fails;
	pline("You disarm %s trap.", the_your[ttmp->madeby_u]);
	cnv_trap_obj(otyp, otyp == SHURIKEN ? 10-rnl(10) : 50-rnl(50), ttmp);
	return 1;
}